

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::AddCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  int local_20;
  int i;
  uint32_t csrc_local;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x14;
  }
  else if (this->numcsrcs < 0xf) {
    for (local_20 = 0; local_20 < this->numcsrcs; local_20 = local_20 + 1) {
      if (this->csrcs[local_20] == csrc) {
        return -0xd;
      }
    }
    this->csrcs[this->numcsrcs] = csrc;
    this->numcsrcs = this->numcsrcs + 1;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0xe;
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::AddCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (numcsrcs >= RTP_MAXCSRCS)
		return ERR_RTP_PACKBUILD_CSRCLISTFULL;

	int i;
	
	for (i = 0 ; i < numcsrcs ; i++)
	{
		if (csrcs[i] == csrc)
			return ERR_RTP_PACKBUILD_CSRCALREADYINLIST;
	}
	csrcs[numcsrcs] = csrc;
	numcsrcs++;
	return 0;
}